

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup * vkt::SpirVAssembly::createOpConstantNullTests(TestContext *testCtx)

{
  string *psVar1;
  NameConstantsCode *pNVar2;
  long lVar3;
  TestCaseGroup *pTVar4;
  mapped_type *pmVar5;
  NameConstantsCode *local_6d0;
  RGBA *local_4d8;
  string local_4c8;
  allocator<char> local_4a1;
  key_type local_4a0;
  allocator<char> local_479;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  allocator<char> local_411;
  key_type local_410;
  undefined1 local_3f0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragments;
  size_t testNdx;
  allocator<char> local_3b0;
  allocator<char> local_3af;
  undefined1 local_3ae;
  undefined1 local_3ad;
  allocator<char> local_3ac;
  allocator<char> local_3ab;
  allocator<char> local_3aa;
  undefined1 local_3a9;
  undefined1 local_3a8;
  allocator<char> local_3a7;
  allocator<char> local_3a6;
  allocator<char> local_3a5;
  undefined1 local_3a4;
  undefined1 local_3a3;
  allocator<char> local_3a2;
  allocator<char> local_3a1;
  allocator<char> local_3a0;
  undefined1 local_39f;
  undefined1 local_39e;
  allocator<char> local_39d;
  allocator<char> local_39c;
  allocator<char> local_39b;
  undefined1 local_39a;
  undefined1 local_399;
  allocator<char> local_398;
  allocator<char> local_397;
  allocator<char> local_396;
  undefined1 local_395;
  undefined1 local_394;
  allocator<char> local_393;
  allocator<char> local_392;
  allocator<char> local_391;
  string *local_390;
  undefined1 local_388 [8];
  NameConstantsCode tests [7];
  char functionEnd [48];
  char functionStart [108];
  RGBA colors [4];
  undefined1 local_28 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> opConstantNullTests;
  TestContext *testCtx_local;
  
  opConstantNullTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
  m_data._8_8_ = testCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    opConstantNullTests.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"opconstantnull","OpConstantNull instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&colors[2].m_value + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28,pTVar4
            );
  local_4d8 = (RGBA *)(functionStart + 0x68);
  do {
    tcu::RGBA::RGBA(local_4d8);
    local_4d8 = local_4d8 + 1;
  } while (local_4d8 != colors + 2);
  builtin_strncpy(functionStart + 0x58," = OpLabel\n",0xc);
  builtin_strncpy(functionStart + 0x48,"r %v4f32\n%lbl   ",0x10);
  builtin_strncpy(functionStart + 0x38,"FunctionParamete",0x10);
  builtin_strncpy(functionStart + 0x28,"ion\n%param1 = Op",0x10);
  builtin_strncpy(functionStart + 0x18,"one %v4f32_funct",0x10);
  builtin_strncpy(functionStart + 8,"unction %v4f32 N",0x10);
  builtin_strncpy(functionEnd + 0x28,"%test_co",8);
  builtin_strncpy(functionStart,"de = OpF",8);
  builtin_strncpy(functionEnd + 0x18,"\nOpFunctionEnd\n",0x10);
  builtin_strncpy(functionEnd + 8,"ransformed_param",0x10);
  tests[6].code.field_2._8_1_ = 'O';
  tests[6].code.field_2._9_1_ = 'p';
  tests[6].code.field_2._10_1_ = 'R';
  tests[6].code.field_2._11_1_ = 'e';
  tests[6].code.field_2._12_1_ = 't';
  tests[6].code.field_2._13_1_ = 'u';
  tests[6].code.field_2._14_1_ = 'r';
  tests[6].code.field_2._15_1_ = 'n';
  builtin_strncpy(functionEnd,"Value %t",8);
  testNdx._4_1_ = 1;
  local_390 = (string *)local_388;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_388,"vec4",&local_391);
  local_395 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[0].name.field_2._M_local_buf + 8),"%cnull = OpConstantNull %v4f32\n",
             &local_392);
  local_394 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[0].constants.field_2._M_local_buf + 8),
             "%transformed_param = OpFAdd %v4f32 %param1 %cnull\n",&local_393);
  local_394 = 0;
  local_395 = 0;
  psVar1 = (string *)(tests[0].code.field_2._M_local_buf + 8);
  local_390 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"float",&local_396);
  local_39a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[1].name.field_2._M_local_buf + 8),"%cnull = OpConstantNull %f32\n",
             &local_397);
  local_399 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[1].constants.field_2._M_local_buf + 8),
             "%vp = OpVariable %fp_v4f32 Function\n%v  = OpLoad %v4f32 %vp\n%v0 = OpVectorInsertDynamic %v4f32 %v %cnull %c_i32_0\n%v1 = OpVectorInsertDynamic %v4f32 %v0 %cnull %c_i32_1\n%v2 = OpVectorInsertDynamic %v4f32 %v1 %cnull %c_i32_2\n%v3 = OpVectorInsertDynamic %v4f32 %v2 %cnull %c_i32_3\n%transformed_param = OpFAdd %v4f32 %param1 %v3\n"
             ,&local_398);
  local_399 = 0;
  local_39a = 0;
  psVar1 = (string *)(tests[1].code.field_2._M_local_buf + 8);
  local_390 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"bool",&local_39b);
  local_39f = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[2].name.field_2._M_local_buf + 8),
             "%cnull             = OpConstantNull %bool\n",&local_39c);
  local_39e = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[2].constants.field_2._M_local_buf + 8),
             "%v                 = OpVariable %fp_v4f32 Function\n                     OpStore %v %param1\n                     OpSelectionMerge %false_label None\n                     OpBranchConditional %cnull %true_label %false_label\n%true_label        = OpLabel\n                     OpStore %v %c_v4f32_0_5_0_5_0_5_0_5\n                     OpBranch %false_label\n%false_label       = OpLabel\n%transformed_param = OpLoad %v4f32 %v\n"
             ,&local_39d);
  local_39e = 0;
  local_39f = 0;
  psVar1 = (string *)(tests[2].code.field_2._M_local_buf + 8);
  local_390 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"i32",&local_3a0);
  local_3a4 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[3].name.field_2._M_local_buf + 8),
             "%cnull             = OpConstantNull %i32\n",&local_3a1);
  local_3a3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[3].constants.field_2._M_local_buf + 8),
             "%v                 = OpVariable %fp_v4f32 Function %c_v4f32_0_5_0_5_0_5_0_5\n%b                 = OpIEqual %bool %cnull %c_i32_0\n                     OpSelectionMerge %false_label None\n                     OpBranchConditional %b %true_label %false_label\n%true_label        = OpLabel\n                     OpStore %v %param1\n                     OpBranch %false_label\n%false_label       = OpLabel\n%transformed_param = OpLoad %v4f32 %v\n"
             ,&local_3a2);
  local_3a3 = 0;
  local_3a4 = 0;
  psVar1 = (string *)(tests[3].code.field_2._M_local_buf + 8);
  local_390 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"struct",&local_3a5);
  local_3a9 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[4].name.field_2._M_local_buf + 8),
             "%stype             = OpTypeStruct %f32 %v4f32\n%fp_stype          = OpTypePointer Function %stype\n%cnull             = OpConstantNull %stype\n"
             ,&local_3a6);
  local_3a8 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[4].constants.field_2._M_local_buf + 8),
             "%v                 = OpVariable %fp_stype Function %cnull\n%f                 = OpAccessChain %fp_v4f32 %v %c_i32_1\n%f_val             = OpLoad %v4f32 %f\n%transformed_param = OpFAdd %v4f32 %param1 %f_val\n"
             ,&local_3a7);
  local_3a8 = 0;
  local_3a9 = 0;
  psVar1 = (string *)(tests[4].code.field_2._M_local_buf + 8);
  local_390 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"array",&local_3aa);
  local_3ae = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[5].name.field_2._M_local_buf + 8),
             "%a4_v4f32          = OpTypeArray %v4f32 %c_u32_4\n%fp_a4_v4f32       = OpTypePointer Function %a4_v4f32\n%cnull             = OpConstantNull %a4_v4f32\n"
             ,&local_3ab);
  local_3ad = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[5].constants.field_2._M_local_buf + 8),
             "%v                 = OpVariable %fp_a4_v4f32 Function %cnull\n%f                 = OpAccessChain %fp_v4f32 %v %c_u32_0\n%f1                = OpAccessChain %fp_v4f32 %v %c_u32_1\n%f2                = OpAccessChain %fp_v4f32 %v %c_u32_2\n%f3                = OpAccessChain %fp_v4f32 %v %c_u32_3\n%f_val             = OpLoad %v4f32 %f\n%f1_val            = OpLoad %v4f32 %f1\n%f2_val            = OpLoad %v4f32 %f2\n%f3_val            = OpLoad %v4f32 %f3\n%t0                = OpFAdd %v4f32 %param1 %f_val\n%t1                = OpFAdd %v4f32 %t0 %f1_val\n%t2                = OpFAdd %v4f32 %t1 %f2_val\n%transformed_param = OpFAdd %v4f32 %t2 %f3_val\n"
             ,&local_3ac);
  local_3ad = 0;
  local_3ae = 0;
  psVar1 = (string *)(tests[5].code.field_2._M_local_buf + 8);
  local_390 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"matrix",&local_3af);
  testNdx._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[6].name.field_2._M_local_buf + 8),
             "%mat4x4_f32        = OpTypeMatrix %v4f32 4\n%cnull             = OpConstantNull %mat4x4_f32\n"
             ,&local_3b0);
  testNdx._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(tests[6].constants.field_2._M_local_buf + 8),
             "%v                 = OpVectorTimesMatrix %v4f32 %param1 %cnull\n%transformed_param = OpFAdd %v4f32 %param1 %v\n"
             ,(allocator<char> *)((long)&testNdx + 7));
  testNdx._6_1_ = 0;
  testNdx._5_1_ = 0;
  testNdx._4_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&testNdx + 7));
  std::allocator<char>::~allocator(&local_3b0);
  std::allocator<char>::~allocator(&local_3af);
  std::allocator<char>::~allocator(&local_3ac);
  std::allocator<char>::~allocator(&local_3ab);
  std::allocator<char>::~allocator(&local_3aa);
  std::allocator<char>::~allocator(&local_3a7);
  std::allocator<char>::~allocator(&local_3a6);
  std::allocator<char>::~allocator(&local_3a5);
  std::allocator<char>::~allocator(&local_3a2);
  std::allocator<char>::~allocator(&local_3a1);
  std::allocator<char>::~allocator(&local_3a0);
  std::allocator<char>::~allocator(&local_39d);
  std::allocator<char>::~allocator(&local_39c);
  std::allocator<char>::~allocator(&local_39b);
  std::allocator<char>::~allocator(&local_398);
  std::allocator<char>::~allocator(&local_397);
  std::allocator<char>::~allocator(&local_396);
  std::allocator<char>::~allocator(&local_393);
  std::allocator<char>::~allocator(&local_392);
  std::allocator<char>::~allocator(&local_391);
  getHalfColorsFullAlpha((RGBA (*) [4])(functionStart + 0x68));
  for (fragments._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      fragments._M_t._M_impl.super__Rb_tree_header._M_node_count < 7;
      fragments._M_t._M_impl.super__Rb_tree_header._M_node_count =
           fragments._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_3f0);
    pNVar2 = tests + fragments._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_410,"pre_main",&local_411);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_3f0,&local_410);
    std::__cxx11::string::operator=
              ((string *)pmVar5,(string *)((pNVar2->name).field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_410);
    std::allocator<char>::~allocator(&local_411);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,functionEnd + 0x28,&local_479);
    std::operator+(&local_458,&local_478,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tests[fragments._M_t._M_impl.super__Rb_tree_header._M_node_count].
                           constants.field_2 + 8));
    std::operator+(&local_438,&local_458,tests[6].code.field_2._M_local_buf + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"testfun",&local_4a1);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_3f0,&local_4a0);
    std::__cxx11::string::operator=((string *)pmVar5,(string *)&local_438);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    std::__cxx11::string::~string((string *)&local_438);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    std::allocator<char>::~allocator(&local_479);
    lVar3 = fragments._M_t._M_impl.super__Rb_tree_header._M_node_count - 1;
    pTVar4 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28
                );
    std::__cxx11::string::string((string *)&local_4c8);
    createTestsForAllStages
              ((string *)((long)&tests[lVar3].code.field_2 + 8),(RGBA (*) [4])(functionStart + 0x68)
               ,(RGBA (*) [4])(functionStart + 0x68),
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_3f0,pTVar4,QP_TEST_RESULT_FAIL,&local_4c8);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_3f0);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28)
  ;
  local_6d0 = (NameConstantsCode *)((long)&tests[6].code.field_2 + 8);
  do {
    local_6d0 = local_6d0 + -1;
    createOpConstantNullTests::NameConstantsCode::~NameConstantsCode(local_6d0);
  } while (local_6d0 != (NameConstantsCode *)local_388);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createOpConstantNullTests(tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> opConstantNullTests		(new tcu::TestCaseGroup(testCtx, "opconstantnull", "OpConstantNull instruction"));
	RGBA							colors[4];


	const char						functionStart[] =
		"%test_code = OpFunction %v4f32 None %v4f32_function\n"
		"%param1 = OpFunctionParameter %v4f32\n"
		"%lbl    = OpLabel\n";

	const char						functionEnd[]	=
		"OpReturnValue %transformed_param\n"
		"OpFunctionEnd\n";

	struct NameConstantsCode
	{
		string name;
		string constants;
		string code;
	};

	NameConstantsCode tests[] =
	{
		{
			"vec4",
			"%cnull = OpConstantNull %v4f32\n",
			"%transformed_param = OpFAdd %v4f32 %param1 %cnull\n"
		},
		{
			"float",
			"%cnull = OpConstantNull %f32\n",
			"%vp = OpVariable %fp_v4f32 Function\n"
			"%v  = OpLoad %v4f32 %vp\n"
			"%v0 = OpVectorInsertDynamic %v4f32 %v %cnull %c_i32_0\n"
			"%v1 = OpVectorInsertDynamic %v4f32 %v0 %cnull %c_i32_1\n"
			"%v2 = OpVectorInsertDynamic %v4f32 %v1 %cnull %c_i32_2\n"
			"%v3 = OpVectorInsertDynamic %v4f32 %v2 %cnull %c_i32_3\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %v3\n"
		},
		{
			"bool",
			"%cnull             = OpConstantNull %bool\n",
			"%v                 = OpVariable %fp_v4f32 Function\n"
			"                     OpStore %v %param1\n"
			"                     OpSelectionMerge %false_label None\n"
			"                     OpBranchConditional %cnull %true_label %false_label\n"
			"%true_label        = OpLabel\n"
			"                     OpStore %v %c_v4f32_0_5_0_5_0_5_0_5\n"
			"                     OpBranch %false_label\n"
			"%false_label       = OpLabel\n"
			"%transformed_param = OpLoad %v4f32 %v\n"
		},
		{
			"i32",
			"%cnull             = OpConstantNull %i32\n",
			"%v                 = OpVariable %fp_v4f32 Function %c_v4f32_0_5_0_5_0_5_0_5\n"
			"%b                 = OpIEqual %bool %cnull %c_i32_0\n"
			"                     OpSelectionMerge %false_label None\n"
			"                     OpBranchConditional %b %true_label %false_label\n"
			"%true_label        = OpLabel\n"
			"                     OpStore %v %param1\n"
			"                     OpBranch %false_label\n"
			"%false_label       = OpLabel\n"
			"%transformed_param = OpLoad %v4f32 %v\n"
		},
		{
			"struct",
			"%stype             = OpTypeStruct %f32 %v4f32\n"
			"%fp_stype          = OpTypePointer Function %stype\n"
			"%cnull             = OpConstantNull %stype\n",
			"%v                 = OpVariable %fp_stype Function %cnull\n"
			"%f                 = OpAccessChain %fp_v4f32 %v %c_i32_1\n"
			"%f_val             = OpLoad %v4f32 %f\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %f_val\n"
		},
		{
			"array",
			"%a4_v4f32          = OpTypeArray %v4f32 %c_u32_4\n"
			"%fp_a4_v4f32       = OpTypePointer Function %a4_v4f32\n"
			"%cnull             = OpConstantNull %a4_v4f32\n",
			"%v                 = OpVariable %fp_a4_v4f32 Function %cnull\n"
			"%f                 = OpAccessChain %fp_v4f32 %v %c_u32_0\n"
			"%f1                = OpAccessChain %fp_v4f32 %v %c_u32_1\n"
			"%f2                = OpAccessChain %fp_v4f32 %v %c_u32_2\n"
			"%f3                = OpAccessChain %fp_v4f32 %v %c_u32_3\n"
			"%f_val             = OpLoad %v4f32 %f\n"
			"%f1_val            = OpLoad %v4f32 %f1\n"
			"%f2_val            = OpLoad %v4f32 %f2\n"
			"%f3_val            = OpLoad %v4f32 %f3\n"
			"%t0                = OpFAdd %v4f32 %param1 %f_val\n"
			"%t1                = OpFAdd %v4f32 %t0 %f1_val\n"
			"%t2                = OpFAdd %v4f32 %t1 %f2_val\n"
			"%transformed_param = OpFAdd %v4f32 %t2 %f3_val\n"
		},
		{
			"matrix",
			"%mat4x4_f32        = OpTypeMatrix %v4f32 4\n"
			"%cnull             = OpConstantNull %mat4x4_f32\n",
			// Our null matrix * any vector should result in a zero vector.
			"%v                 = OpVectorTimesMatrix %v4f32 %param1 %cnull\n"
			"%transformed_param = OpFAdd %v4f32 %param1 %v\n"
		}
	};

	getHalfColorsFullAlpha(colors);

	for (size_t testNdx = 0; testNdx < sizeof(tests) / sizeof(NameConstantsCode); ++testNdx)
	{
		map<string, string> fragments;
		fragments["pre_main"] = tests[testNdx].constants;
		fragments["testfun"] = string(functionStart) + tests[testNdx].code + functionEnd;
		createTestsForAllStages(tests[testNdx].name, colors, colors, fragments, opConstantNullTests.get());
	}
	return opConstantNullTests.release();
}